

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_doors.cpp
# Opt level: O0

void __thiscall DDoor::DoorSound(DDoor *this,bool raise,DSeqNode *curseq)

{
  char cVar1;
  short sVar2;
  sector_t *sec;
  line_t *plVar3;
  uint uVar4;
  bool bVar5;
  int iVar6;
  FTextureID texnum;
  char *name;
  FTexture *pFVar7;
  char *local_90;
  FTexture *tex;
  line_t *line;
  char *texname;
  char *pcStack_30;
  int i;
  char *snd;
  DSeqNode *pDStack_20;
  int choice;
  DSeqNode *curseq_local;
  DDoor *pDStack_10;
  bool raise_local;
  DDoor *this_local;
  
  snd._4_4_ = (uint)((raise ^ 0xffU) & 1);
  if ((((this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector)->Flags & 0x40) == 0)
  {
    if (8.0 <= this->m_Speed) {
      snd._4_4_ = snd._4_4_ + 2;
    }
    uVar4 = snd._4_4_;
    pDStack_20 = curseq;
    curseq_local._7_1_ = raise;
    pDStack_10 = this;
    if (((this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector)->seqType < 0) {
      bVar5 = FName::operator!=(&(((this->super_DMovingCeiling).super_DMover.super_DSectorEffect.
                                  m_Sector)->SeqName).super_FName,NAME_None);
      if (bVar5) {
        if (pDStack_20 != (DSeqNode *)0x0) {
          name = FName::operator_cast_to_char_
                           (&(((this->super_DMovingCeiling).super_DMover.super_DSectorEffect.
                              m_Sector)->SeqName).super_FName);
          uVar4 = snd._4_4_;
          iVar6 = DSeqNode::GetModeNum(pDStack_20);
          bVar5 = SN_AreModesSame(name,uVar4,iVar6);
          if (bVar5) {
            return;
          }
        }
        sec = (this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector;
        FName::FName((FName *)&snd,
                     &(((this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector)->
                      SeqName).super_FName);
        SN_StartSequence(sec,2,(FName *)&snd,snd._4_4_);
      }
      else {
        if (gameinfo.gametype == GAME_Heretic) {
          pcStack_30 = "HereticDoor";
        }
        else if (gameinfo.gametype == GAME_Strife) {
          pcStack_30 = "DoorSmallMetal";
          for (texname._4_4_ = 0;
              texname._4_4_ <
              ((this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector)->linecount;
              texname._4_4_ = texname._4_4_ + 1) {
            plVar3 = ((this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector)->lines
                     [texname._4_4_];
            if (plVar3->backsector != (sector_t *)0x0) {
              texnum = side_t::GetTexture(plVar3->sidedef[0],0);
              pFVar7 = FTextureManager::operator[](&TexMan,texnum);
              if (pFVar7 == (FTexture *)0x0) {
                local_90 = (char *)0x0;
              }
              else {
                local_90 = FString::GetChars(&pFVar7->Name);
              }
              if ((((local_90 != (char *)0x0) && (*local_90 == 'D')) && (local_90[1] == 'O')) &&
                 (local_90[2] == 'R')) {
                cVar1 = local_90[3];
                if (cVar1 == 'M') {
                  if (local_90[4] == 'L') {
                    pcStack_30 = "DoorLargeMetal";
                  }
                }
                else if (cVar1 == 'S') {
                  pcStack_30 = "DoorStone";
                }
                else if (cVar1 == 'W') {
                  if (local_90[4] == 'L') {
                    pcStack_30 = "DoorLargeWood";
                  }
                  else {
                    pcStack_30 = "DoorSmallWood";
                  }
                }
              }
            }
          }
        }
        else {
          pcStack_30 = "DoorNormal";
        }
        uVar4 = snd._4_4_;
        if (pDStack_20 != (DSeqNode *)0x0) {
          iVar6 = DSeqNode::GetModeNum(pDStack_20);
          bVar5 = SN_AreModesSame(pcStack_30,uVar4,iVar6);
          if (bVar5) {
            return;
          }
        }
        SN_StartSequence((this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector,2,
                         pcStack_30,snd._4_4_);
      }
    }
    else {
      if (curseq != (DSeqNode *)0x0) {
        sVar2 = ((this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector)->seqType;
        iVar6 = DSeqNode::GetModeNum(curseq);
        bVar5 = SN_AreModesSame((int)sVar2,SEQ_DOOR,uVar4,iVar6);
        if (bVar5) {
          return;
        }
      }
      SN_StartSequence((this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector,2,
                       (int)((this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector)
                            ->seqType,SEQ_DOOR,snd._4_4_,false);
    }
  }
  return;
}

Assistant:

void DDoor::DoorSound(bool raise, DSeqNode *curseq) const
{
	int choice;

	// For multiple-selection sound sequences, the following choices are used:
	//  0  Opening
	//  1  Closing
	//  2  Opening fast
	//  3  Closing fast

	choice = !raise;

	if (m_Sector->Flags & SECF_SILENTMOVE) return;

	if (m_Speed >= 8)
	{
		choice += 2;
	}

	if (m_Sector->seqType >= 0)
	{
		if (curseq == NULL || !SN_AreModesSame(m_Sector->seqType, SEQ_DOOR, choice, curseq->GetModeNum()))
		{
			SN_StartSequence(m_Sector, CHAN_CEILING, m_Sector->seqType, SEQ_DOOR, choice);
		}
	}
	else if (m_Sector->SeqName != NAME_None)
	{
		if (curseq == NULL || !SN_AreModesSame(m_Sector->SeqName, choice, curseq->GetModeNum()))
		{
			SN_StartSequence(m_Sector, CHAN_CEILING, m_Sector->SeqName, choice);
		}
	}
	else
	{
		const char *snd;

		switch (gameinfo.gametype)
		{
		default:	/* Doom and Hexen */
			snd = "DoorNormal";
			break;
			
		case GAME_Heretic:
			snd = "HereticDoor";
			break;

		case GAME_Strife:
			snd = "DoorSmallMetal";

			// Search the front top textures of 2-sided lines on the door sector
			// for a door sound to use.
			for (int i = 0; i < m_Sector->linecount; ++i)
			{
				const char *texname;
				line_t *line = m_Sector->lines[i];

				if (line->backsector == NULL)
					continue;

				FTexture *tex = TexMan[line->sidedef[0]->GetTexture(side_t::top)];
				texname = tex ? tex->Name.GetChars() : NULL;
				if (texname != NULL && texname[0] == 'D' && texname[1] == 'O' && texname[2] == 'R')
				{
					switch (texname[3])
					{
					case 'S':
						snd = "DoorStone";
						break;

					case 'M':
						if (texname[4] == 'L')
						{
							snd = "DoorLargeMetal";
						}
						break;

					case 'W':
						if (texname[4] == 'L')
						{
							snd = "DoorLargeWood";
						}
						else
						{
							snd = "DoorSmallWood";
						}
						break;
					}
				}
			}
			break;
		}
		if (curseq == NULL || !SN_AreModesSame(snd, choice, curseq->GetModeNum()))
		{
			SN_StartSequence(m_Sector, CHAN_CEILING, snd, choice);
		}
	}
}